

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

void split_common(saucy *s,coloring *c,int cf,int ff)

{
  int *piVar1;
  int *piVar2;
  char *pcVar3;
  long lVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  piVar5 = c->clen;
  lVar4 = (long)cf;
  iVar7 = piVar5[lVar4];
  piVar5[lVar4] = ~cf + ff;
  lVar9 = (long)ff;
  iVar6 = (iVar7 + cf) - ff;
  piVar5[lVar9] = iVar6;
  if (ff <= iVar7 + cf) {
    piVar1 = c->cfront;
    piVar2 = c->lab;
    lVar8 = 0;
    do {
      piVar1[piVar2[lVar9 + lVar8]] = ff;
      lVar8 = lVar8 + 1;
    } while (iVar6 + 1 != (int)lVar8);
  }
  pcVar3 = s->indmark;
  if ((pcVar3[lVar4] == '\0') && (piVar5[lVar4] <= piVar5[lVar9])) {
    if (piVar5[lVar4] == 0) {
      piVar5 = s->sinduce;
      iVar7 = s->nsinduce;
      s->nsinduce = iVar7 + 1;
    }
    else {
      piVar5 = s->ninduce;
      iVar7 = s->nninduce;
      s->nninduce = iVar7 + 1;
    }
    piVar5[iVar7] = cf;
  }
  else {
    if (piVar5[lVar9] == 0) {
      piVar5 = s->sinduce;
      iVar7 = s->nsinduce;
      s->nsinduce = iVar7 + 1;
    }
    else {
      piVar5 = s->ninduce;
      iVar7 = s->nninduce;
      s->nninduce = iVar7 + 1;
    }
    piVar5[iVar7] = ff;
    lVar4 = lVar9;
  }
  pcVar3[lVar4] = '\x01';
  return;
}

Assistant:

static void
split_color(struct coloring *c, int cf, int ff)
{
    int cb, fb;

    /* Fix lengths */
    fb = ff - 1;
    cb = cf + c->clen[cf];
    c->clen[cf] = fb - cf;
    c->clen[ff] = cb - ff;

    /* Fix cell front pointers */
    fix_fronts(c, ff, ff);
}